

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

int lws_tls_server_conn_alpn(lws *wsi)

{
  uint *puVar1;
  lws_tls_conn *plVar2;
  int iVar3;
  ulong __n;
  uint len;
  uchar *name;
  char cstr [10];
  uint local_34;
  void *local_30;
  char local_22 [10];
  
  local_30 = (void *)0x0;
  plVar2 = (wsi->tls).ssl;
  if (plVar2 == (lws_tls_conn *)0x0) {
    iVar3 = 0;
  }
  else {
    SSL_get0_alpn_selected(plVar2,&local_30,&local_34);
    if (local_34 == 0) {
      iVar3 = 0;
      _lws_log(8,"no ALPN upgrade\n");
    }
    else {
      if (9 < local_34) {
        local_34 = 9;
      }
      __n = (ulong)local_34;
      memcpy(local_22,local_30,__n);
      local_22[__n] = '\0';
      _lws_log(8,"negotiated \'%s\' using ALPN\n",local_22);
      puVar1 = &(wsi->tls).use_ssl;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
      iVar3 = lws_role_call_alpn_negotiated(wsi,local_22);
    }
  }
  return iVar3;
}

Assistant:

int
lws_tls_server_conn_alpn(struct lws *wsi)
{
#if defined(LWS_WITH_MBEDTLS) || (defined(OPENSSL_VERSION_NUMBER) && \
				  OPENSSL_VERSION_NUMBER >= 0x10002000L)
	const unsigned char *name = NULL;
	char cstr[10];
	unsigned len;

	if (!wsi->tls.ssl)
		return 0;

	SSL_get0_alpn_selected(wsi->tls.ssl, &name, &len);
	if (!len) {
		lwsl_info("no ALPN upgrade\n");
		return 0;
	}

	if (len > sizeof(cstr) - 1)
		len = sizeof(cstr) - 1;

	memcpy(cstr, name, len);
	cstr[len] = '\0';

	lwsl_info("negotiated '%s' using ALPN\n", cstr);
	wsi->tls.use_ssl |= LCCSCF_USE_SSL;

	return lws_role_call_alpn_negotiated(wsi, (const char *)cstr);
#endif // OPENSSL_VERSION_NUMBER >= 0x10002000L

	return 0;
}